

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O1

djg_buffer * djgb_create(int data_size)

{
  djg_buffer *pdVar1;
  GLint buf;
  GLuint local_1c;
  
  pdVar1 = (djg_buffer *)malloc(0x10);
  local_1c = 0;
  if (data_size - 1U < 0x1ffff) {
    pdVar1->capacity = 0x100000;
    pdVar1->size = data_size;
    pdVar1->offset = 0;
    (*glad_glGenBuffers)(1,(GLuint *)pdVar1);
    (*glad_glGetIntegerv)(0x8894,(GLint *)&local_1c);
    (*glad_glBindBuffer)(0x8892,pdVar1->gl);
    (*glad_glBufferData)(0x8892,(long)pdVar1->capacity,(void *)0x0,0x88e0);
    (*glad_glBindBuffer)(0x8892,local_1c);
    return pdVar1;
  }
  __assert_fail("data_size > 0 && buf_capacity > 8 * data_size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                ,0x280,"djg_buffer *djgb_create(int)");
}

Assistant:

DJGDEF djg_buffer *djgb_create(int data_size)
{
    const int buf_capacity = (1 << 20); // capacity in Bytes
    djg_buffer *buffer = (djg_buffer*)DJG_MALLOC(sizeof(*buffer));
    GLint buf = 0;

    DJG_ASSERT(data_size > 0 && buf_capacity > 8 * data_size);

    buffer->capacity = buf_capacity;
    buffer->size = data_size;
    buffer->offset = 0;

    glGenBuffers(1, &buffer->gl);
    glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &buf);
    glBindBuffer(GL_ARRAY_BUFFER, buffer->gl);
    glBufferData(GL_ARRAY_BUFFER, buffer->capacity, NULL, GL_STREAM_DRAW);
    glBindBuffer(GL_ARRAY_BUFFER, buf);

    return buffer;
}